

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O2

void __thiscall bandit::reporter::info::output_context_end_message(info *this)

{
  ostream *poVar1;
  _Elt_pointer pcVar2;
  string local_80;
  string local_60 [32];
  string local_40 [32];
  
  pcVar2 = (this->context_stack_).c.
           super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pcVar2 == (this->context_stack_).c.
                super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pcVar2 = (this->context_stack_).c.
             super__Deque_base<bandit::reporter::info::context_info,_std::allocator<bandit::reporter::info::context_info>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 10;
  }
  this->indentation_ = this->indentation_ + -1;
  poVar1 = (this->super_colored_base).stm_;
  indent_abi_cxx11_(&local_80,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_80);
  (*((this->super_colored_base).colorizer_)->_vptr_interface[4])(local_40);
  poVar1 = std::operator<<(poVar1,local_40);
  poVar1 = std::operator<<(poVar1,"end ");
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(local_60);
  poVar1 = std::operator<<(poVar1,local_60);
  std::operator<<(poVar1,(string *)(pcVar2 + -1));
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::~string((string *)&local_80);
  if (0 < pcVar2[-1].total) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[6])(&local_80);
    poVar1 = std::operator<<(poVar1,(string *)&local_80);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pcVar2[-1].total);
    std::operator<<(poVar1," total");
    std::__cxx11::string::~string((string *)&local_80);
  }
  if (0 < pcVar2[-1].skipped) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[3])(&local_80);
    poVar1 = std::operator<<(poVar1,(string *)&local_80);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pcVar2[-1].skipped);
    std::operator<<(poVar1," skipped");
    std::__cxx11::string::~string((string *)&local_80);
  }
  if (0 < pcVar2[-1].failed) {
    poVar1 = (this->super_colored_base).stm_;
    (*((this->super_colored_base).colorizer_)->_vptr_interface[5])(&local_80);
    poVar1 = std::operator<<(poVar1,(string *)&local_80);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pcVar2[-1].failed);
    std::operator<<(poVar1," failed");
    std::__cxx11::string::~string((string *)&local_80);
  }
  poVar1 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(&local_80);
  poVar1 = std::operator<<(poVar1,(string *)&local_80);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void output_context_end_message() {
        const context_info& context = context_stack_.top();
        --indentation_;
        stm_
            << indent()
            << colorizer_.info()
            << "end "
            << colorizer_.reset()
            << context.desc;
        if (context.total > 0) {
          stm_
              << colorizer_.emphasize()
              << " " << context.total << " total";
        }
        if (context.skipped > 0) {
          stm_
              << colorizer_.neutral()
              << " " << context.skipped << " skipped";
        }
        if (context.failed > 0) {
          stm_
              << colorizer_.bad()
              << " " << context.failed << " failed";
        }
        stm_ << colorizer_.reset() << std::endl;
      }